

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O0

bool __thiscall ZlibWriter::reset_zlib(ZlibWriter *this,int compression_level)

{
  int iVar1;
  int zresult;
  int compression_level_local;
  ZlibWriter *this_local;
  
  (this->z).zalloc = (alloc_func)0x0;
  (this->z).zfree = (free_func)0x0;
  (this->z).opaque = (voidpf)0x0;
  iVar1 = deflateInit_(&this->z,9,"1.2.11",0x70);
  return iVar1 == 0;
}

Assistant:

bool ZlibWriter::reset_zlib(int compression_level)
{
	int zresult;

	z.zalloc = Z_NULL;
	z.zfree = Z_NULL;
	z.opaque = Z_NULL;
	zresult = deflateInit(&z, Z_BEST_COMPRESSION);

	return (zresult == Z_OK);
}